

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O3

void __thiscall
charls::jpeg_stream_reader::try_read_hp_color_transform_segment(jpeg_stream_reader *this)

{
  int *piVar1;
  int *piVar2;
  byte bVar3;
  array<unsigned_char,_4UL> mrfx_tag;
  
  if ((this->segment_data_).size_ != 5) {
    __assert_fail("segment_data_.size() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_reader.cpp"
                  ,0x29e,"void charls::jpeg_stream_reader::try_read_hp_color_transform_segment()");
  }
  piVar2 = (int *)this->position_;
  piVar1 = piVar2 + 1;
  if (piVar1 <= this->end_position_) {
    this->position_ = (iterator)piVar1;
    if (*piVar2 == 0x7866726d) {
      bVar3 = read_byte(this);
      if (3 < bVar3) {
        if (bVar3 + ~HP3 < 2) {
          impl::throw_jpegls_error(UnsupportedColorTransform);
        }
        impl::throw_jpegls_error(InvalidCompressedData);
      }
      (this->parameters_).transformation = (uint)bVar3;
    }
    return;
  }
  __assert_fail("position_ + byte_count <= end_position_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_reader.cpp"
                ,0x264,"const_byte_span charls::jpeg_stream_reader::read_bytes(const size_t)");
}

Assistant:

void jpeg_stream_reader::try_read_hp_color_transform_segment()
{
    ASSERT(segment_data_.size() == 5);

    const array<uint8_t, 4> mrfx_tag{'m', 'r', 'f', 'x'}; // mrfx = xfrm (in big endian) = colorXFoRM
    if (!equal(mrfx_tag.cbegin(), mrfx_tag.cend(), read_bytes(4).begin()))
        return;

    const auto transformation{read_byte()};
    switch (transformation)
    {
    case static_cast<uint8_t>(color_transformation::none):
    case static_cast<uint8_t>(color_transformation::hp1):
    case static_cast<uint8_t>(color_transformation::hp2):
    case static_cast<uint8_t>(color_transformation::hp3):
        parameters_.transformation = static_cast<color_transformation>(transformation);
        return;

    case 4: // RgbAsYuvLossy (The standard lossy RGB to YCbCr transform used in JPEG.)
    case 5: // Matrix (transformation is controlled using a matrix that is also stored in the segment.
        throw_jpegls_error(jpegls_errc::color_transform_not_supported);

    default:
        throw_jpegls_error(jpegls_errc::invalid_encoded_data);
    }
}